

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode_file(uchar **out,uint *w,uint *h,char *filename,LodePNGColorType colortype,
                        uint bitdepth)

{
  undefined4 in_R8D;
  undefined4 in_R9D;
  uint error;
  size_t buffersize;
  uchar *buffer;
  LodePNGColorType in_stack_0000017c;
  size_t in_stack_00000180;
  uchar *in_stack_00000188;
  uint *in_stack_00000190;
  uint *in_stack_00000198;
  uchar **in_stack_000001a0;
  uint in_stack_000001b0;
  undefined4 local_3c;
  char *in_stack_ffffffffffffffc8;
  size_t *in_stack_ffffffffffffffd0;
  
  local_3c = lodepng_load_file((uchar **)CONCAT44(in_R8D,in_R9D),in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffc8);
  if (local_3c == 0) {
    local_3c = lodepng_decode_memory
                         (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188,
                          in_stack_00000180,in_stack_0000017c,in_stack_000001b0);
  }
  lodepng_free((void *)0x2b5649);
  return local_3c;
}

Assistant:

unsigned lodepng_decode_file(unsigned char** out, unsigned* w, unsigned* h, const char* filename,
                             LodePNGColorType colortype, unsigned bitdepth)
{
  unsigned char* buffer;
  size_t buffersize;
  unsigned error;
  error = lodepng_load_file(&buffer, &buffersize, filename);
  if(!error) error = lodepng_decode_memory(out, w, h, buffer, buffersize, colortype, bitdepth);
  lodepng_free(buffer);
  return error;
}